

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O1

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port)

{
  int *piVar1;
  long *plVar2;
  curl_socket_t sockfd;
  Curl_easy *data;
  bool bVar3;
  bool bVar4;
  _Bool _Var5;
  CURLcode CVar6;
  int iVar7;
  CHUNKcode CVar8;
  int iVar9;
  char *pcVar10;
  Curl_send_buffer *buff;
  char *pcVar11;
  char *pcVar12;
  time_t tVar13;
  long lVar14;
  undefined8 extraout_RAX;
  char *pcVar15;
  ulong uVar16;
  char *pcVar17;
  char *pcVar18;
  uint uVar19;
  char *pcVar20;
  char cVar21;
  bool bVar22;
  CURLcode local_ac;
  long local_98;
  int local_8c;
  char *local_88;
  int subversion;
  ulong local_60;
  char *local_58;
  ssize_t gotbytes;
  long *local_48;
  long local_40;
  ssize_t local_38;
  
  if ((conn->tunnel_state[sockindex] == TUNNEL_INIT) && (conn->connect_buffer == (char *)0x0)) {
    pcVar10 = (char *)(*Curl_cmalloc)(0x4000);
    conn->connect_buffer = pcVar10;
    if (pcVar10 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  subversion = 0;
  if (conn->tunnel_state[sockindex] == TUNNEL_COMPLETE) {
    local_ac = CURLE_OK;
  }
  else {
    data = conn->data;
    sockfd = conn->sock[sockindex];
    (conn->bits).proxy_connect_closed = false;
    local_48 = &(data->info).request_size;
    piVar1 = &(data->req).httpcode;
    local_8c = 0;
    local_60 = 0;
    bVar4 = false;
    local_98 = 0;
    local_58 = hostname;
    do {
      pcVar10 = local_58;
      if (conn->tunnel_state[sockindex] == TUNNEL_INIT) {
        Curl_infof(data,"Establish HTTP proxy tunnel to %s:%hu\n",local_58);
        (*Curl_cfree)((data->req).newurl);
        (data->req).newurl = (char *)0x0;
        buff = Curl_add_buffer_init();
        if (buff == (Curl_send_buffer *)0x0) {
LAB_0051aa87:
          bVar3 = false;
          local_ac = CURLE_OUT_OF_MEMORY;
        }
        else {
          pcVar10 = curl_maprintf("%s:%hu",pcVar10,(ulong)(uint)remote_port);
          if (pcVar10 == (char *)0x0) {
            Curl_add_buffer_free(buff);
            goto LAB_0051aa87;
          }
          CVar6 = Curl_http_output_auth(conn,"CONNECT",pcVar10,true);
          (*Curl_cfree)(pcVar10);
          pcVar10 = local_58;
          if (CVar6 == CURLE_OK) {
            pcVar18 = "1.1";
            if ((conn->http_proxy).proxytype == CURLPROXY_HTTP_1_0) {
              pcVar18 = "1.0";
            }
            if ((conn->host).name == local_58) {
              cVar21 = (conn->bits).ipv6_ip;
            }
            else {
              pcVar11 = strchr(local_58,0x3a);
              cVar21 = pcVar11 != (char *)0x0;
            }
            pcVar15 = "";
            pcVar11 = "";
            if (cVar21 != '\0') {
              pcVar11 = "[";
              pcVar15 = "]";
            }
            pcVar10 = curl_maprintf("%s%s%s:%hu",pcVar11,pcVar10,pcVar15,(ulong)(uint)remote_port);
            if (pcVar10 == (char *)0x0) {
              Curl_add_buffer_free(buff);
              local_ac = CURLE_OUT_OF_MEMORY;
              bVar3 = false;
              CVar6 = CURLE_OK;
            }
            else {
              pcVar11 = Curl_checkProxyheaders(conn,"Host:");
              if (pcVar11 == (char *)0x0) {
                pcVar11 = curl_maprintf("Host: %s\r\n");
                if (pcVar11 == (char *)0x0) {
                  (*Curl_cfree)(pcVar10);
                  Curl_add_buffer_free(buff);
                  local_ac = CURLE_OUT_OF_MEMORY;
                  bVar3 = false;
                  CVar6 = CURLE_OK;
                  goto LAB_0051ac9b;
                }
              }
              else {
                pcVar11 = (char *)0x0;
              }
              pcVar15 = Curl_checkProxyheaders(conn,"Proxy-Connection:");
              pcVar20 = "";
              if (pcVar15 == (char *)0x0) {
                pcVar20 = "Proxy-Connection: Keep-Alive\r\n";
              }
              pcVar12 = Curl_checkProxyheaders(conn,"User-Agent:");
              pcVar15 = "";
              if ((pcVar12 == (char *)0x0) && (pcVar15 = "", (data->set).str[0x24] != (char *)0x0))
              {
                pcVar15 = (conn->allocptr).uagent;
              }
              pcVar12 = pcVar11;
              if (pcVar11 == (char *)0x0) {
                pcVar12 = "";
              }
              pcVar17 = (conn->allocptr).proxyuserpwd;
              if (pcVar17 == (char *)0x0) {
                pcVar17 = "";
              }
              CVar6 = Curl_add_bufferf(buff,"CONNECT %s HTTP/%s\r\n%s%s%s%s",pcVar10,pcVar18,pcVar12
                                       ,pcVar17,pcVar15,pcVar20);
              if (pcVar11 != (char *)0x0) {
                (*Curl_cfree)(pcVar11);
              }
              (*Curl_cfree)(pcVar10);
              if (CVar6 == CURLE_OK) {
                CVar6 = Curl_add_custom_headers(conn,true,buff);
              }
              if (CVar6 == CURLE_OK) {
                CVar6 = Curl_add_bufferf(buff,"\r\n");
              }
              if (CVar6 == CURLE_OK) {
                CVar6 = Curl_add_buffer_send(buff,conn,local_48,0,sockindex);
              }
              bVar3 = true;
              if (CVar6 != CURLE_OK) {
                Curl_failf(data,"Failed sending CONNECT to proxy");
              }
              buff = (Curl_send_buffer *)0x0;
            }
LAB_0051ac9b:
            if (bVar3) goto LAB_0051aca0;
            bVar3 = false;
          }
          else {
LAB_0051aca0:
            Curl_add_buffer_free(buff);
            if (CVar6 == CURLE_OK) {
              conn->tunnel_state[sockindex] = TUNNEL_CONNECT;
              bVar3 = true;
            }
            else {
              bVar3 = false;
              local_ac = CVar6;
            }
          }
        }
        if (!bVar3) goto LAB_0051b635;
      }
      tVar13 = Curl_timeleft(data,(timeval *)0x0,true);
      if (tVar13 < 1) {
        Curl_failf(data,"Proxy CONNECT aborted due to timeout");
        goto LAB_0051b62f;
      }
      _Var5 = Curl_conn_data_pending(conn,sockindex);
      if (!_Var5) goto LAB_0051b60a;
      uVar16 = 0;
      bVar3 = bVar4;
LAB_0051ad06:
      do {
        bVar4 = bVar3;
        local_88 = conn->connect_buffer;
        uVar19 = 1;
        lVar14 = 0;
        pcVar10 = local_88;
LAB_0051ad1d:
        do {
          if (((0x3fff < uVar16) || (uVar19 == 0)) || (local_8c != 0)) {
LAB_0051b331:
            iVar9 = Curl_pgrsUpdate(conn);
            iVar7 = 1;
            if (iVar9 != 0) {
              local_ac = CURLE_ABORTED_BY_CALLBACK;
              goto LAB_0051b401;
            }
            if (local_8c != 0) {
              local_ac = CURLE_RECV_ERROR;
              goto LAB_0051b401;
            }
            if ((data->info).httpproxycode != 200) {
              CVar6 = Curl_http_auth_act(conn);
              if (CVar6 != CURLE_OK) {
                local_8c = 0;
                local_ac = CVar6;
                goto LAB_0051b401;
              }
              if ((conn->bits).close != false) {
                bVar4 = true;
              }
            }
            local_8c = 0;
            if ((bVar4) && ((data->req).newurl != (char *)0x0)) {
              Curl_closesocket(conn,conn->sock[sockindex]);
              conn->sock[sockindex] = -1;
              iVar7 = 2;
            }
            else {
              iVar7 = 0;
            }
            goto LAB_0051b401;
          }
          uVar16 = uVar16 + 1;
          local_40 = lVar14;
          while( true ) {
            while( true ) {
              iVar7 = Curl_pgrsUpdate(conn);
              if (iVar7 != 0) {
                local_ac = CURLE_ABORTED_BY_CALLBACK;
                CVar6 = local_ac;
                goto LAB_0051b2de;
              }
              if (conn->connect_buffer + 0x4000 <= pcVar10) {
                Curl_failf(data,"CONNECT response too large!");
                local_ac = CURLE_RECV_ERROR;
                CVar6 = local_ac;
                goto LAB_0051b2de;
              }
              tVar13 = Curl_timeleft(data,(timeval *)0x0,true);
              if (tVar13 < 1) {
                Curl_failf(data,"Proxy CONNECT aborted due to timeout");
                local_8c = 2;
                goto LAB_0051b331;
              }
              CVar6 = Curl_read(conn,sockfd,pcVar10,1,&gotbytes);
              if (CVar6 != CURLE_AGAIN) break;
              if (999 < tVar13) {
                tVar13 = 1000;
              }
              iVar7 = Curl_socket_check(sockfd,-1,-1,tVar13);
              if (iVar7 == -1) {
                Curl_failf(data,"Proxy CONNECT aborted due to select/poll error");
                local_8c = 1;
                goto LAB_0051b331;
              }
            }
            if (CVar6 != CURLE_OK) goto LAB_0051b331;
            if (gotbytes < 1) {
              if (((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0)) {
                Curl_failf(data,"Proxy CONNECT aborted");
                local_8c = 1;
              }
              else {
                (conn->bits).proxy_connect_closed = true;
                Curl_infof(data,"Proxy CONNECT connection closed\n");
              }
              goto LAB_0051b331;
            }
            if (uVar19 < 2) break;
            pcVar10 = conn->connect_buffer;
            if (local_98 == 0) {
              local_38 = 0;
              CVar8 = Curl_httpchunk_read(conn,pcVar10,1,&local_38);
              uVar19 = 2;
              if (CVar8 == CHUNKE_STOP) {
                uVar19 = 0;
                Curl_infof(data,"chunk reading DONE\n");
                conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
              }
              lVar14 = 0;
            }
            else {
              lVar14 = local_98 + -1;
              uVar19 = 2;
              bVar3 = local_98 < 2;
              local_98 = lVar14;
              if (bVar3) goto LAB_0051b331;
            }
            local_98 = lVar14;
            if (uVar19 == 0) goto LAB_0051b331;
            uVar16 = 1;
          }
          lVar14 = (long)(int)local_40 + 1;
          cVar21 = *pcVar10;
          pcVar10 = pcVar10 + 1;
          uVar19 = 1;
        } while (cVar21 != '\n');
        if ((data->set).verbose == true) {
          Curl_debug(data,CURLINFO_HEADER_IN,local_88,(long)(int)lVar14,conn);
        }
        if (((data->set).suppress_connect_headers == false) &&
           (CVar6 = Curl_client_write(conn,(data->set).include_header | 2,local_88,(long)(int)lVar14
                                     ), CVar6 != CURLE_OK)) break;
        plVar2 = &(data->info).header_size;
        *plVar2 = *plVar2 + lVar14;
        plVar2 = &(data->req).headerbytecount;
        *plVar2 = *plVar2 + lVar14;
        if ((*local_88 == '\r') || (*local_88 == '\n')) {
          pcVar10 = conn->connect_buffer;
          uVar19 = 0;
          if ((*piVar1 == 0x197) && ((data->state).authproblem == false)) {
            if (local_98 == 0) {
              if ((local_60 & 1) != 0) {
                Curl_infof(data,"Ignore chunked response-body\n");
                (data->req).ignorebody = true;
                if (local_88[1] == '\n') {
                  local_88 = local_88 + 1;
                }
                CVar8 = Curl_httpchunk_read(conn,local_88 + 1,1,&gotbytes);
                uVar19 = 2;
                if (CVar8 == CHUNKE_STOP) {
                  uVar19 = 0;
                  Curl_infof(data,"chunk reading DONE\n");
                  conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
                }
              }
            }
            else {
              Curl_infof(data,"Ignore %ld bytes of response-body\n",local_98);
              uVar19 = 2;
            }
          }
          conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
          uVar16 = 0;
          goto LAB_0051ad1d;
        }
        local_88[lVar14] = '\0';
        iVar7 = curl_strnequal("WWW-Authenticate:",local_88,0x11);
        bVar3 = bVar4;
        if (((iVar7 == 0) || (*piVar1 != 0x191)) &&
           ((iVar7 = curl_strnequal("Proxy-authenticate:",local_88,0x13), iVar7 == 0 ||
            (*piVar1 != 0x197)))) {
          iVar7 = curl_strnequal("Content-Length:",local_88,0xf);
          if (iVar7 == 0) {
            _Var5 = Curl_compareheader(local_88,"Connection:","close");
            bVar3 = true;
            if (_Var5) goto LAB_0051ad06;
            iVar7 = curl_strnequal("Transfer-Encoding:",local_88,0x12);
            if (iVar7 == 0) {
              _Var5 = Curl_compareheader(local_88,"Proxy-Connection:","close");
              bVar3 = true;
              if ((!_Var5) &&
                 (iVar7 = __isoc99_sscanf(local_88,"HTTP/1.%d %d",&subversion,piVar1), bVar3 = bVar4
                 , iVar7 == 2)) {
                (data->info).httpproxycode = (data->req).httpcode;
              }
              goto LAB_0051ad06;
            }
            if (99 < *piVar1 - 200U) {
              _Var5 = Curl_compareheader(local_88,"Transfer-Encoding:","chunked");
              bVar3 = bVar4;
              if (_Var5) {
                Curl_infof(data,"CONNECT responded chunked\n");
                Curl_httpchunk_init(conn);
                local_60 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
              }
              goto LAB_0051ad06;
            }
            pcVar10 = "Ignoring Transfer-Encoding in CONNECT %03d response\n";
          }
          else {
            if (99 < *piVar1 - 200U) {
              local_98 = strtol(local_88 + 0xf,(char **)0x0,10);
              goto LAB_0051ad06;
            }
            pcVar10 = "Ignoring Content-Length in CONNECT %03d response\n";
          }
          Curl_infof(data,pcVar10);
          bVar3 = bVar4;
          goto LAB_0051ad06;
        }
        iVar7 = *piVar1;
        pcVar10 = Curl_copy_header_value(local_88);
        if (pcVar10 == (char *)0x0) {
          local_ac = CURLE_OUT_OF_MEMORY;
          bVar22 = false;
        }
        else {
          CVar6 = Curl_http_input_auth(conn,iVar7 == 0x197,pcVar10);
          (*Curl_cfree)(pcVar10);
          bVar22 = CVar6 == CURLE_OK;
          if (!bVar22) {
            local_ac = CVar6;
          }
        }
        CVar6 = local_ac;
      } while (bVar22);
LAB_0051b2de:
      local_ac = CVar6;
      iVar7 = 1;
LAB_0051b401:
      if (iVar7 != 0) {
        if (iVar7 != 2) goto LAB_0051b635;
        break;
      }
      if (((data->req).newurl != (char *)0x0) && (conn->tunnel_state[sockindex] == TUNNEL_COMPLETE))
      {
        conn->tunnel_state[sockindex] = TUNNEL_INIT;
        Curl_infof(data,"TUNNEL_STATE switched to: %d\n",0);
      }
    } while ((data->req).newurl != (char *)0x0);
    if (*piVar1 == 200) {
      conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
      (*Curl_cfree)((conn->allocptr).proxyuserpwd);
      (conn->allocptr).proxyuserpwd = (char *)0x0;
      (data->state).authproxy.done = true;
      local_ac = CURLE_OK;
      Curl_infof(data,"Proxy replied OK to CONNECT request\n");
      (data->req).ignorebody = false;
      (conn->bits).rewindaftersend = false;
    }
    else {
      if ((bVar4) && ((data->req).newurl != (char *)0x0)) {
        (conn->bits).proxy_connect_closed = true;
        Curl_infof(data,"Connect me again please\n");
      }
      else {
        (*Curl_cfree)((data->req).newurl);
        (data->req).newurl = (char *)0x0;
        Curl_conncontrol(conn,2);
        Curl_closesocket(conn,conn->sock[sockindex]);
        conn->sock[sockindex] = -1;
      }
      conn->tunnel_state[sockindex] = TUNNEL_INIT;
      if ((conn->bits).proxy_connect_closed == false) {
        Curl_failf(data,"Received HTTP code %d from proxy after CONNECT",
                   (ulong)(uint)(data->req).httpcode);
LAB_0051b62f:
        local_ac = CURLE_RECV_ERROR;
      }
      else {
LAB_0051b60a:
        local_ac = CURLE_OK;
      }
    }
  }
LAB_0051b635:
  if ((local_ac != CURLE_OK) || (conn->tunnel_state[sockindex] == TUNNEL_COMPLETE)) {
    (*Curl_cfree)(conn->connect_buffer);
    conn->connect_buffer = (char *)0x0;
  }
  return local_ac;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  CURLcode result;
  if(TUNNEL_INIT == conn->tunnel_state[sockindex]) {
    if(!conn->connect_buffer) {
      conn->connect_buffer = malloc(CONNECT_BUFFER_SIZE);
      if(!conn->connect_buffer)
        return CURLE_OUT_OF_MEMORY;
    }
  }
  result = CONNECT(conn, sockindex, hostname, remote_port);

  if(result || (TUNNEL_COMPLETE == conn->tunnel_state[sockindex]))
    Curl_safefree(conn->connect_buffer);

  return result;
}